

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

unsigned_long mxx::exscan<unsigned_long,std::plus<unsigned_long>>(undefined8 x,MPI_Op param_2)

{
  unsigned_long uVar1;
  int iVar2;
  MPI_Datatype poVar3;
  MPI_Op poVar4;
  MPI_Comm poVar5;
  unsigned_long local_70;
  unsigned_long result;
  undefined1 local_60 [8];
  custom_op<unsigned_long,_true> op;
  comm *comm_local;
  unsigned_long *x_local;
  
  op.m_op = param_2;
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>();
  poVar3 = custom_op<unsigned_long,_true>::get_type((custom_op<unsigned_long,_true> *)local_60);
  poVar4 = custom_op<unsigned_long,_true>::get_op((custom_op<unsigned_long,_true> *)local_60);
  poVar5 = comm::operator_cast_to_ompi_communicator_t_((comm *)op.m_op);
  MPI_Exscan(x,&local_70,1,poVar3,poVar4,poVar5);
  iVar2 = comm::rank((comm *)op.m_op);
  if (iVar2 == 0) {
    local_70 = 0;
  }
  uVar1 = local_70;
  custom_op<unsigned_long,_true>::~custom_op((custom_op<unsigned_long,_true> *)local_60);
  return uVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}